

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mocker::ir::Interpreter::Interpreter(Interpreter *this,string *source)

{
  string local_60;
  string local_40;
  
  (this->globalVars).
  super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->globalVars).
  super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->globalVars).
  super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->funcs)._M_h._M_buckets = &(this->funcs)._M_h._M_single_bucket;
  (this->funcs)._M_h._M_bucket_count = 1;
  (this->funcs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcs)._M_h._M_element_count = 0;
  (this->funcs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->externalFuncs)._M_h._M_buckets = &(this->externalFuncs)._M_h._M_single_bucket;
  (this->externalFuncs)._M_h._M_bucket_count = 1;
  (this->externalFuncs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->externalFuncs)._M_h._M_element_count = 0;
  (this->externalFuncs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->externalFuncs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->externalFuncs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalReg)._M_h._M_buckets = &(this->globalReg)._M_h._M_single_bucket;
  (this->globalReg)._M_h._M_bucket_count = 1;
  (this->globalReg)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalReg)._M_h._M_element_count = 0;
  (this->globalReg)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalReg)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalReg)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  stack<mocker::ir::Interpreter::ActivationRecord,std::deque<mocker::ir::Interpreter::ActivationRecord,std::allocator<mocker::ir::Interpreter::ActivationRecord>>>
  ::
  stack<std::deque<mocker::ir::Interpreter::ActivationRecord,std::allocator<mocker::ir::Interpreter::ActivationRecord>>,void>
            (&this->ars);
  (this->malloced).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->curSize = 0;
  (this->malloced).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->malloced).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initExternalFuncs(this);
  std::__cxx11::string::string((string *)&local_40,(string *)source);
  deleteComments(&local_60,this,&local_40);
  parse(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

Interpreter::Interpreter(std::string source) {
  initExternalFuncs();
  parse(deleteComments(std::move(source)));
}